

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbndmat.cpp
# Opt level: O0

void __thiscall TPZFBMatrix<double>::TPZFBMatrix(TPZFBMatrix<double> *this)

{
  TPZRegisterClassId *in_RDI;
  int64_t in_stack_ffffffffffffffd8;
  int64_t in_stack_ffffffffffffffe0;
  void **vtt;
  TPZManVector<int,_5> *this_00;
  
  this_00 = (TPZManVector<int,_5> *)0x0;
  vtt = (void **)0x21;
  TPZRegisterClassId::TPZRegisterClassId<TPZFBMatrix<double>>(in_RDI,0x21);
  TPZMatrix<double>::TPZMatrix
            ((TPZMatrix<double> *)this_00,vtt,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  *(undefined ***)in_RDI = &PTR__TPZFBMatrix_024243a8;
  TPZVec<double>::TPZVec((TPZVec<double> *)(in_RDI + 0x20));
  TPZManVector<int,_5>::TPZManVector(this_00,(int64_t)vtt);
  *(undefined8 *)(in_RDI + 0x40) = 0;
  *(undefined8 *)(in_RDI + 0x48) = 0;
  return;
}

Assistant:

TPZFBMatrix<TVar>::TPZFBMatrix()
: TPZRegisterClassId(&TPZFBMatrix::ClassId),
TPZMatrix<TVar>( 0, 0 ), fElem()
{
	fBandLower = 0;
    fBandUpper = 0;
}